

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

InsertionResult * __thiscall
QHashPrivate::Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_>::findOrInsert<QString>
          (InsertionResult *__return_storage_ptr__,
          Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_> *this,QString *key)

{
  Span *pSVar1;
  bool bVar2;
  size_t hash;
  ulong uVar3;
  QStringView QVar4;
  Bucket BVar5;
  size_t *local_38;
  
  QVar4.m_data = (key->d).ptr;
  QVar4.m_size = (key->d).size;
  hash = qHash(QVar4,this->seed);
  if (this->numBuckets == 0) {
    uVar3 = this->size;
LAB_005e7269:
    rehash(this,uVar3 + 1);
    BVar5 = findBucketWithHash<QString>(this,key,hash);
  }
  else {
    BVar5 = findBucketWithHash<QString>(this,key,hash);
    bVar2 = true;
    if ((BVar5.span)->offsets[BVar5.index] != 0xff) goto LAB_005e729c;
    uVar3 = this->size;
    if (this->numBuckets >> 1 <= uVar3) goto LAB_005e7269;
  }
  local_38 = &this->size;
  Span<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_>::insert(BVar5.span,BVar5.index);
  *local_38 = *local_38 + 1;
  bVar2 = false;
LAB_005e729c:
  pSVar1 = this->spans;
  (__return_storage_ptr__->it).d = this;
  (__return_storage_ptr__->it).bucket =
       ((ulong)((long)BVar5.span - (long)pSVar1) >> 4) * 0x1c71c71c71c71c80 | BVar5.index;
  __return_storage_ptr__->initialized = bVar2;
  return __return_storage_ptr__;
}

Assistant:

InsertionResult findOrInsert(const K &key) noexcept
    {
        Bucket it(static_cast<Span *>(nullptr), 0);
        size_t hash = QHashPrivate::calculateHash(key, seed);
        if (numBuckets > 0) {
            it = findBucketWithHash(key, hash);
            if (!it.isUnused())
                return { it.toIterator(this), true };
        }
        if (shouldGrow()) {
            rehash(size + 1);
            it = findBucketWithHash(key, hash); // need to get a new iterator after rehashing
        }
        Q_ASSERT(it.span != nullptr);
        Q_ASSERT(it.isUnused());
        it.insert();
        ++size;
        return { it.toIterator(this), false };
    }